

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_flush(Byte *compr,uLong *comprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  int iVar3;
  int extraout_EAX_02;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr;
  char **ppcVar6;
  char *pcVar7;
  undefined8 *extraout_RDX;
  char *__s1;
  undefined4 uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong *puVar13;
  uLong auStack_268 [2];
  undefined1 *puStack_258;
  char *pcStack_250;
  ulong uStack_240;
  undefined4 uStack_238;
  undefined4 uStack_220;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  uLong uStack_1e0;
  char *pcStack_1d0;
  undefined1 *puStack_1c8;
  code *pcStack_1c0;
  char *pcStack_1b8;
  int iStack_1b0;
  undefined1 *puStack_1a0;
  undefined4 uStack_198;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uLong uStack_158;
  ulong uStack_140;
  code *pcStack_138;
  ulong uStack_128;
  uint uStack_120;
  undefined4 uStack_108;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  uLong *puStack_b8;
  char *pcStack_b0;
  Byte *pBStack_a8;
  code *pcStack_a0;
  char *local_90;
  uint local_88;
  Byte *local_78;
  undefined4 local_70;
  uLong local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  pcStack_a0 = (code *)0x10325a;
  sVar4 = strlen(hello);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uVar9 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_a0 = (code *)0x103287;
  iVar1 = deflateInit_(&local_90,0xffffffff,"1.2.8");
  if (iVar1 == 0) {
    local_90 = hello;
    local_88 = 3;
    local_70 = (undefined4)*comprLen;
    uVar9 = 3;
    pcStack_a0 = (code *)0x1032ad;
    local_78 = compr;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_001032fa;
    compr[3] = compr[3] + '\x01';
    local_88 = (int)sVar4 - 2;
    sVar4 = (size_t)local_88;
    uVar9 = 4;
    pcStack_a0 = (code *)0x1032cc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103301;
    pcStack_a0 = (code *)0x1032db;
    uVar2 = deflateEnd(&local_90);
    if (uVar2 == 0) {
      *comprLen = local_68;
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_a0 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_a0 = (code *)0x103308;
    test_flush_cold_4();
    uVar2 = extraout_EAX;
  }
  uVar12 = (ulong)uVar2;
  pcStack_a0 = test_sync;
  test_flush_cold_3();
  pcStack_b0 = hello;
  *extraout_RDX = 0x65676162726167;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_120 = 2;
  pcVar10 = "1.2.8";
  pcStack_138 = (code *)0x103362;
  uStack_128 = uVar12;
  puStack_b8 = comprLen;
  pBStack_a8 = compr;
  pcStack_a0 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_128,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_108 = SUB84(ppcVar6,0);
    pcVar10 = (char *)0x0;
    pcStack_138 = (code *)0x10337f;
    inflate(&uStack_128);
    uStack_120 = (int)uVar9 - 2;
    uVar9 = (ulong)uStack_120;
    pcStack_138 = (code *)0x103390;
    iVar1 = inflateSync(&uStack_128);
    if (iVar1 != 0) goto LAB_001033da;
    pcVar10 = (char *)0x4;
    pcStack_138 = (code *)0x1033a3;
    iVar1 = inflate(&uStack_128);
    if (iVar1 != -3) goto LAB_001033e1;
    pcStack_138 = (code *)0x1033b2;
    uVar2 = inflateEnd(&uStack_128);
    if (uVar2 == 0) {
      pcStack_138 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX);
      return;
    }
  }
  else {
    pcStack_138 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_138 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_138 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar2 = extraout_EAX_00;
  }
  puVar13 = (ulong *)(ulong)uVar2;
  pcStack_138 = test_dict_deflate;
  test_sync_cold_4();
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uVar8 = 9;
  pcVar7 = (char *)0x70;
  pcStack_1c0 = (code *)0x103424;
  uStack_140 = uVar9;
  pcStack_138 = (code *)ppcVar6;
  iVar1 = deflateInit_(&pcStack_1b8,9,"1.2.8");
  if (iVar1 == 0) {
    uVar8 = 0x104004;
    pcStack_1c0 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&pcStack_1b8,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = uStack_158;
    uStack_198 = SUB84(pcVar10,0);
    pcStack_1b8 = hello;
    pcStack_1c0 = (code *)0x103465;
    puStack_1a0 = (undefined1 *)puVar13;
    sVar4 = strlen(hello);
    iStack_1b0 = (int)sVar4 + 1;
    uVar8 = 4;
    pcStack_1c0 = (code *)0x103478;
    iVar1 = deflate(&pcStack_1b8);
    ppcVar6 = &pcStack_1b8;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_1c0 = (code *)0x103485;
    uVar2 = deflateEnd(&pcStack_1b8);
    ppcVar6 = &pcStack_1b8;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_1c0 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_1c0 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_01;
  }
  uVar9 = (ulong)uVar2;
  pcStack_1c0 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  pcVar11 = "1.2.8";
  uStack_240 = uVar9;
  uStack_238 = uVar8;
  pcStack_1d0 = pcVar10;
  puStack_1c8 = (undefined1 *)puVar13;
  pcStack_1c0 = (code *)ppcVar6;
  iVar1 = inflateInit_(&uStack_240,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_220 = SUB84(pcVar7,0);
    pcVar7 = "hello";
    do {
      pcVar11 = (char *)0x0;
      iVar1 = inflate(&uStack_240);
      if (iVar1 == 2) {
        if (uStack_1e0 != dictId) {
          test_dict_inflate_cold_2();
          puVar13 = &uStack_240;
          goto LAB_0010358d;
        }
        pcVar11 = "hello";
        iVar1 = inflateSetDictionary(&uStack_240,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&uStack_240);
    puVar13 = &uStack_240;
    if (iVar1 == 0) {
      pcVar11 = hello;
      pcVar10 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar10;
      puVar13 = &uStack_240;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_02;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  auStack_268[0] = 40000;
  puStack_258 = (undefined1 *)puVar13;
  pcStack_250 = pcVar7;
  pcVar10 = (char *)zlibVersion();
  if (*pcVar10 == '1') {
    pcVar10 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar10,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr,40000);
      if (iVar1 < 2) {
        pcVar10 = "foo.gz";
      }
      else {
        pcVar10 = *(char **)(pcVar11 + 8);
      }
      test_gzio(pcVar10,uncompr,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr,40000);
      test_large_deflate(compr_00,40000,uncompr,40000);
      test_large_inflate(compr_00,40000,uncompr,40000);
      test_flush(compr_00,auStack_268);
      test_sync(compr_00,auStack_268[0],uncompr,40000);
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr,40000);
      free(compr_00);
      free(uncompr);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_flush(compr, comprLen)
    Byte *compr;
    uLong *comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uInt len = (uInt)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;
    c_stream.avail_in = 3;
    c_stream.avail_out = (uInt)*comprLen;
    err = deflate(&c_stream, Z_FULL_FLUSH);
    CHECK_ERR(err, "deflate");

    compr[3]++; /* force an error in first compressed block */
    c_stream.avail_in = len - 3;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        CHECK_ERR(err, "deflate");
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");

    *comprLen = c_stream.total_out;
}